

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar.c
# Opt level: O0

void test_read_format_tar(void)

{
  verifyEmpty();
  verify((EVP_PKEY_CTX *)archive1,(uchar *)0x158,0x1c9080,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archive2,(uchar *)0x159,0x1c9340,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archive3,(uchar *)0x159,0x1c95d0,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archive4,(uchar *)0x159,0x1c9850,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archive5,(uchar *)0x158,0x1c9ad0,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archive6,(uchar *)0x159,0x1c9ca0,(uchar *)0x0,0x30001);
  verify((EVP_PKEY_CTX *)archiveK,(uchar *)0x52c,0x1c9f20,(uchar *)0x0,0x30004);
  verify((EVP_PKEY_CTX *)archivexL,(uchar *)0x558,0x1ca1b0,(uchar *)0x0,0x30002);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_tar)
{
	verifyEmpty();
	verify(archive1, sizeof(archive1), verify1,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archive2, sizeof(archive2), verify2,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archive3, sizeof(archive3), verify3,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archive4, sizeof(archive4), verify4,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archive5, sizeof(archive5), verify5,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archive6, sizeof(archive6), verify6,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_USTAR);
	verify(archiveK, sizeof(archiveK), verifyK,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_GNUTAR);
	verify(archivexL, sizeof(archivexL), verifyxL,
	    ARCHIVE_FILTER_NONE, ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);
}